

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall
google::protobuf::UninterpretedOption::MergePartialFromCodedStream
          (UninterpretedOption *this,CodedInputStream *input)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  WireType WVar4;
  UninterpretedOption_NamePart *value;
  string *psVar5;
  char *pcVar6;
  UnknownFieldSet *unknown_fields;
  double dVar7;
  uint32 tag;
  CodedInputStream *input_local;
  UninterpretedOption *this_local;
  uint32 local_d0;
  uint64 local_48;
  uint64 temp;
  CodedInputStream *local_38;
  undefined1 local_29;
  uint64 local_28;
  uint64 temp_1;
  CodedInputStream *local_18;
  undefined1 local_9;
  
LAB_00308a97:
  do {
    if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ < 0x80)) {
      input->last_tag_ = (uint)*input->buffer_;
      io::CodedInputStream::Advance(input,1);
      local_d0 = input->last_tag_;
    }
    else {
      uVar2 = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = uVar2;
      local_d0 = input->last_tag_;
    }
    if (local_d0 == 0) {
      return true;
    }
    iVar3 = internal::WireFormatLite::GetTagFieldNumber(local_d0);
    switch(iVar3) {
    case 2:
      WVar4 = internal::WireFormatLite::GetTagWireType(local_d0);
      if (WVar4 == WIRETYPE_LENGTH_DELIMITED) {
        do {
          value = add_name(this);
          bVar1 = internal::WireFormatLite::
                  ReadMessageNoVirtual<google::protobuf::UninterpretedOption_NamePart>(input,value);
          if (!bVar1) {
            return false;
          }
          if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\x12')) {
            io::CodedInputStream::Advance(input,1);
            bVar1 = true;
          }
          else {
            bVar1 = false;
          }
        } while (bVar1);
        if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\x1a')) {
          io::CodedInputStream::Advance(input,1);
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
        if (bVar1) {
LAB_00308dcd:
          psVar5 = mutable_identifier_value_abi_cxx11_(this);
          bVar1 = internal::WireFormatLite::ReadString(input,psVar5);
          if (!bVar1) {
            return false;
          }
          identifier_value_abi_cxx11_(this);
          pcVar6 = (char *)std::__cxx11::string::data();
          identifier_value_abi_cxx11_(this);
          iVar3 = std::__cxx11::string::length();
          internal::WireFormat::VerifyUTF8String(pcVar6,iVar3,PARSE);
          if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == ' ')) {
            io::CodedInputStream::Advance(input,1);
            bVar1 = true;
          }
          else {
            bVar1 = false;
          }
          if (bVar1) {
LAB_00308f6f:
            bVar1 = io::CodedInputStream::ReadVarint64(input,&this->positive_int_value_);
            if (!bVar1) {
              return false;
            }
            set_has_positive_int_value(this);
            if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '(')) {
              io::CodedInputStream::Advance(input,1);
              bVar1 = true;
            }
            else {
              bVar1 = false;
            }
            if (bVar1) {
LAB_003090f4:
              temp = (uint64)&this->negative_int_value_;
              local_38 = input;
              local_29 = io::CodedInputStream::ReadVarint64(input,&local_48);
              if (!(bool)local_29) {
                return false;
              }
              *(uint64 *)temp = local_48;
              set_has_negative_int_value(this);
              if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '1')) {
                io::CodedInputStream::Advance(input,1);
                bVar1 = true;
              }
              else {
                bVar1 = false;
              }
              if (bVar1) {
LAB_00309294:
                temp_1 = (uint64)&this->double_value_;
                local_18 = input;
                bVar1 = io::CodedInputStream::ReadLittleEndian64(input,&local_28);
                if (!bVar1) {
                  return false;
                }
                dVar7 = internal::WireFormatLite::DecodeDouble(local_28);
                *(double *)temp_1 = dVar7;
                local_9 = bVar1;
                set_has_double_value(this);
                if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == ':')) {
                  io::CodedInputStream::Advance(input,1);
                  bVar1 = true;
                }
                else {
                  bVar1 = false;
                }
                if (bVar1) {
LAB_0030943a:
                  psVar5 = mutable_string_value_abi_cxx11_(this);
                  bVar1 = internal::WireFormatLite::ReadBytes(input,psVar5);
                  if (!bVar1) {
                    return false;
                  }
                  if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == 'B')) {
                    io::CodedInputStream::Advance(input,1);
                    bVar1 = true;
                  }
                  else {
                    bVar1 = false;
                  }
                  if (bVar1) {
LAB_003095b5:
                    psVar5 = mutable_aggregate_value_abi_cxx11_(this);
                    bVar1 = internal::WireFormatLite::ReadString(input,psVar5);
                    if (!bVar1) {
                      return false;
                    }
                    aggregate_value_abi_cxx11_(this);
                    pcVar6 = (char *)std::__cxx11::string::data();
                    aggregate_value_abi_cxx11_(this);
                    iVar3 = std::__cxx11::string::length();
                    internal::WireFormat::VerifyUTF8String(pcVar6,iVar3,PARSE);
                    bVar1 = io::CodedInputStream::ExpectAtEnd(input);
                    if (bVar1) {
                      return true;
                    }
                  }
                }
              }
            }
          }
        }
        goto LAB_00308a97;
      }
      break;
    case 3:
      WVar4 = internal::WireFormatLite::GetTagWireType(local_d0);
      if (WVar4 == WIRETYPE_LENGTH_DELIMITED) goto LAB_00308dcd;
      break;
    case 4:
      WVar4 = internal::WireFormatLite::GetTagWireType(local_d0);
      if (WVar4 == WIRETYPE_VARINT) goto LAB_00308f6f;
      break;
    case 5:
      WVar4 = internal::WireFormatLite::GetTagWireType(local_d0);
      if (WVar4 == WIRETYPE_VARINT) goto LAB_003090f4;
      break;
    case 6:
      WVar4 = internal::WireFormatLite::GetTagWireType(local_d0);
      if (WVar4 == WIRETYPE_FIXED64) goto LAB_00309294;
      break;
    case 7:
      WVar4 = internal::WireFormatLite::GetTagWireType(local_d0);
      if (WVar4 == WIRETYPE_LENGTH_DELIMITED) goto LAB_0030943a;
      break;
    case 8:
      WVar4 = internal::WireFormatLite::GetTagWireType(local_d0);
      if (WVar4 == WIRETYPE_LENGTH_DELIMITED) goto LAB_003095b5;
    }
    WVar4 = internal::WireFormatLite::GetTagWireType(local_d0);
    if (WVar4 == WIRETYPE_END_GROUP) {
      return true;
    }
    unknown_fields = mutable_unknown_fields(this);
    bVar1 = internal::WireFormat::SkipField(input,local_d0,unknown_fields);
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool UninterpretedOption::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_name:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_name()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_name;
        if (input->ExpectTag(26)) goto parse_identifier_value;
        break;
      }

      // optional string identifier_value = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_identifier_value:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_identifier_value()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->identifier_value().data(), this->identifier_value().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(32)) goto parse_positive_int_value;
        break;
      }

      // optional uint64 positive_int_value = 4;
      case 4: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_positive_int_value:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &positive_int_value_)));
          set_has_positive_int_value();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(40)) goto parse_negative_int_value;
        break;
      }

      // optional int64 negative_int_value = 5;
      case 5: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_negative_int_value:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &negative_int_value_)));
          set_has_negative_int_value();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(49)) goto parse_double_value;
        break;
      }

      // optional double double_value = 6;
      case 6: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_FIXED64) {
         parse_double_value:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &double_value_)));
          set_has_double_value();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(58)) goto parse_string_value;
        break;
      }

      // optional bytes string_value = 7;
      case 7: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_string_value:
          DO_(::google::protobuf::internal::WireFormatLite::ReadBytes(
                input, this->mutable_string_value()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(66)) goto parse_aggregate_value;
        break;
      }

      // optional string aggregate_value = 8;
      case 8: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_aggregate_value:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_aggregate_value()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->aggregate_value().data(), this->aggregate_value().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}